

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Vec_Int_t * Gia_ManReverseLevel(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint *puVar4;
  long lVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *__s;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  
  uVar1 = p->nObjs;
  uVar13 = (ulong)uVar1;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar12 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar12 = uVar1;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar12;
  if (uVar12 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar12 << 2);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = uVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)(int)uVar1 << 2);
  }
  if (1 < (int)uVar1) {
    iVar2 = p->nObjs;
    lVar9 = uVar13 + 1;
    lVar5 = uVar13 * 3;
    do {
      if (iVar2 < (int)uVar1) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        return pVVar7;
      }
      lVar10 = lVar9 + -1;
      uVar15 = *(ulong *)(&pGVar3[-1].field_0x0 + lVar5 * 4);
      uVar12 = (uint)uVar15;
      if ((uVar15 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
        if ((long)uVar13 < lVar10) goto LAB_0023fc25;
        iVar11 = __s[lVar9 + -2];
        puVar4 = p->pMuxes;
        iVar6 = (int)lVar9;
        if ((puVar4 == (uint *)0x0) || (puVar4[lVar9 + -2] == 0)) {
          uVar14 = (uint)(uVar15 >> 0x20);
          if (((int)(uVar15 & 0x1fffffff) == 0x1fffffff || (int)uVar12 < 0) ||
             ((uVar14 & 0x1fffffff) <= (uVar12 & 0x1fffffff))) {
            uVar8 = uVar12 & 0x1fffffff;
            uVar15 = ((ulong)-uVar8 + lVar9) - 2;
            if ((((int)uVar12 < 0) || (uVar8 == 0x1fffffff)) || (uVar8 != (uVar14 & 0x1fffffff))) {
              if (uVar1 <= (uint)uVar15) goto LAB_0023fc25;
              if (__s[uVar15 & 0xffffffff] <= iVar11) {
                __s[uVar15 & 0xffffffff] = iVar11 + 1;
              }
              uVar12 = (iVar6 - (*(uint *)(&pGVar3[-1].field_0x4 + lVar5 * 4) & 0x1fffffff)) - 2;
              if (uVar1 <= uVar12) goto LAB_0023fc25;
              if (__s[uVar12] <= iVar11) {
                __s[uVar12] = iVar11 + 1;
              }
              goto LAB_0023fc05;
            }
            if (uVar1 <= (uint)uVar15) goto LAB_0023fc25;
            uVar15 = uVar15 & 0xffffffff;
          }
          else {
            uVar12 = (iVar6 - (uVar12 & 0x1fffffff)) - 2;
            if (uVar1 <= uVar12) goto LAB_0023fc25;
            iVar11 = iVar11 + 2;
            if (__s[uVar12] < iVar11) {
              __s[uVar12] = iVar11;
            }
            uVar12 = (iVar6 - (*(uint *)(&pGVar3[-1].field_0x4 + lVar5 * 4) & 0x1fffffff)) - 2;
            if (uVar1 <= uVar12) goto LAB_0023fc25;
            uVar15 = (ulong)uVar12;
          }
        }
        else {
          uVar12 = (iVar6 - (uVar12 & 0x1fffffff)) - 2;
          if (uVar1 <= uVar12) {
LAB_0023fc25:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar11 = iVar11 + 2;
          if (__s[uVar12] < iVar11) {
            __s[uVar12] = iVar11;
          }
          uVar12 = (iVar6 - (*(uint *)(&pGVar3[-1].field_0x4 + lVar5 * 4) & 0x1fffffff)) - 2;
          if (uVar1 <= uVar12) goto LAB_0023fc25;
          if (__s[uVar12] < iVar11) {
            __s[uVar12] = iVar11;
          }
          uVar12 = 0xffffffff;
          if (puVar4 != (uint *)0x0) {
            uVar14 = puVar4[lVar9 + -2];
            if (uVar14 != 0) {
              if ((int)uVar14 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              uVar12 = uVar14 >> 1;
            }
          }
          if (uVar1 <= uVar12) goto LAB_0023fc25;
          uVar15 = (ulong)uVar12;
        }
        if (__s[uVar15] < iVar11) {
          __s[uVar15] = iVar11;
        }
      }
LAB_0023fc05:
      lVar9 = lVar10;
      lVar5 = lVar5 + -3;
    } while (2 < lVar10);
  }
  return pVVar7;
}

Assistant:

Vec_Int_t * Gia_ManReverseLevel( Gia_Man_t * p )  
{
    Vec_Int_t * vLevelRev;
    Gia_Obj_t * pObj;
    int i;
    vLevelRev = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAndReverse( p, pObj, i )
    {
        int LevelR = Vec_IntEntry( vLevelRev, i );
        if ( Gia_ObjIsMux(p, pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId2(p, i), LevelR + 2 );
        }
        else if ( Gia_ObjIsXor(pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 2 );
        }
        else if ( Gia_ObjIsBuf(pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR );
        }
        else
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 1 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 1 );
        }
    }
    return vLevelRev;
}